

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O3

bool __thiscall
pstore::command_line::
list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
::value(list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
        *this,string *v)

{
  bool bVar1;
  _List_node_base *p_Var2;
  _List_node_base local_30;
  
  if ((this->super_option).comma_separated_ != true) {
    bVar1 = simple_value(this,v);
    return bVar1;
  }
  csv((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&local_30,v);
  p_Var2 = &local_30;
  do {
    p_Var2 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == &local_30) break;
    bVar1 = simple_value(this,(string *)(p_Var2 + 1));
  } while (bVar1);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_30);
  return p_Var2 == &local_30;
}

Assistant:

bool list<T, Parser>::value (std::string const & v) {
            if (this->allow_comma_separated ()) {
                return this->comma_separated (v);
            }

            return this->simple_value (v);
        }